

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthWidget.cpp
# Opt level: O1

void __thiscall
SynthWidget::refreshAudioDeviceList(SynthWidget *this,Master *master,AudioDevice *useAudioDevice)

{
  QComboBox *pQVar1;
  QPushButton *pQVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  AudioDevice *audioDevice;
  QString t;
  AudioDevice *local_b8;
  AudioDevice *local_b0;
  QArrayData *local_a8;
  QArrayData *local_a0;
  char16_t *local_98;
  qsizetype qStack_90;
  QString local_88;
  QString *local_70;
  long local_68;
  QObject local_60 [8];
  QIcon local_58 [8];
  anon_union_24_3_e3d07ef4_for_data local_50;
  
  local_b0 = useAudioDevice;
  QObject::disconnect((QObject *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,
                      "2currentIndexChanged(int)",(QObject *)this,
                      "1on_audioDeviceComboBox_currentIndexChanged(int)");
  QComboBox::clear();
  Master::getAudioDevices((QList<const_AudioDevice_*> *)&local_50,master);
  local_68 = local_50._8_8_;
  if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50.shared = *(int *)local_50.shared + 1;
    UNLOCK();
  }
  local_a8 = (QArrayData *)local_50.shared;
  if ((QArrayData *)local_50.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_50.shared = *(int *)local_50.shared + -1;
    UNLOCK();
    if (*(int *)local_50.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_50.shared,8,8);
    }
  }
  if (local_50._16_8_ != 0) {
    local_70 = &local_b0->name;
    lVar6 = local_50._16_8_ << 3;
    lVar5 = 0;
    do {
      local_b8 = *(AudioDevice **)(local_68 + lVar5 * 8);
      pQVar1 = (this->ui->super_Ui_SynthWidget).audioDeviceComboBox;
      operator+(&local_88,&local_b8->driver->name,": ");
      local_a0 = &(local_88.d.d)->super_QArrayData;
      local_98 = local_88.d.ptr;
      qStack_90 = local_88.d.size;
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append((QString *)&local_a0);
      QVariant::QVariant((QVariant *)&local_50,(QMetaType)0x1cf650,&local_b8);
      uVar4 = QComboBox::count();
      QIcon::QIcon(local_58);
      QComboBox::insertItem
                ((int)pQVar1,(QIcon *)(ulong)uVar4,(QString *)local_58,(QVariant *)&local_a0);
      QIcon::~QIcon(local_58);
      QVariant::~QVariant((QVariant *)&local_50);
      if (local_a0 != (QArrayData *)0x0) {
        LOCK();
        (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_a0,2,8);
        }
      }
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,8);
        }
      }
      if (local_b0 != (AudioDevice *)0x0) {
        bVar3 = operator==(&local_b0->driver->id,&local_b8->driver->id);
        if (bVar3) {
          bVar3 = operator==(local_70,&local_b8->name);
          if (bVar3) {
            QComboBox::setCurrentIndex((int)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox);
          }
        }
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  pQVar2 = (this->ui->super_Ui_SynthWidget).audioPropertiesButton;
  QComboBox::count();
  QWidget::setEnabled(SUB81(pQVar2,0));
  QObject::connect(local_60,(char *)(this->ui->super_Ui_SynthWidget).audioDeviceComboBox,
                   (QObject *)"2currentIndexChanged(int)",(char *)this,0x191596);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  if (local_a8 != (QArrayData *)0x0) {
    LOCK();
    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_a8,8,8);
    }
  }
  return;
}

Assistant:

void SynthWidget::refreshAudioDeviceList(Master *master, const AudioDevice *useAudioDevice) {
	disconnect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), this, SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
	ui->audioDeviceComboBox->clear();
	int audioDeviceIndex = 0;
	QListIterator<const AudioDevice *> audioDeviceIt(master->getAudioDevices());
	while(audioDeviceIt.hasNext()) {
		const AudioDevice *audioDevice = audioDeviceIt.next();
		ui->audioDeviceComboBox->addItem(audioDevice->driver.name + ": " + audioDevice->name, QVariant::fromValue(audioDevice));
		if (useAudioDevice != NULL && useAudioDevice->driver.id == audioDevice->driver.id
				&& useAudioDevice->name == audioDevice->name) ui->audioDeviceComboBox->setCurrentIndex(audioDeviceIndex);
		audioDeviceIndex++;
	}
	ui->audioPropertiesButton->setEnabled(ui->audioDeviceComboBox->count() != 0);
	connect(ui->audioDeviceComboBox, SIGNAL(currentIndexChanged(int)), SLOT(on_audioDeviceComboBox_currentIndexChanged(int)));
}